

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::setTimeLevel(NavierStokesBase *this,Real time,Real dt_old,Real dt_new)

{
  Real in_RDI;
  StateData *in_XMM0_Qa;
  Real in_XMM1_Qa;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *in_XMM2_Qa;
  
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            (in_XMM2_Qa,(size_type)in_RDI);
  amrex::StateData::setTimeLevel(in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
  if (have_divu != 0) {
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              (in_XMM2_Qa,(size_type)in_RDI);
    amrex::StateData::setTimeLevel(in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
    if (have_dsdt != 0) {
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                (in_XMM2_Qa,(size_type)in_RDI);
      amrex::StateData::setTimeLevel(in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
    }
  }
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            (in_XMM2_Qa,(size_type)in_RDI);
  amrex::StateData::setTimeLevel(in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            (in_XMM2_Qa,(size_type)in_RDI);
  amrex::StateData::setTimeLevel(in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
  return;
}

Assistant:

void
NavierStokesBase::setTimeLevel (Real time,
                                Real dt_old,
                                Real dt_new)
{
    state[State_Type].setTimeLevel(time,dt_old,dt_new);

    if (have_divu)
    {
        state[Divu_Type].setTimeLevel(time,dt_old,dt_new);
        if (have_dsdt)
        {
            state[Dsdt_Type].setTimeLevel(time,dt_old,dt_new);
        }
    }

    state[Press_Type].setTimeLevel(time-dt_old,dt_old,dt_old);

    state[Gradp_Type].setTimeLevel(time-dt_old,dt_old,dt_old);
}